

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

Edge __thiscall
geometrycentral::surface::SurfaceMesh::separateToNewEdge
          (SurfaceMesh *this,Halfedge heA,Halfedge heB)

{
  ulong *puVar1;
  bool bVar2;
  pointer puVar3;
  pointer puVar4;
  runtime_error *this_00;
  ParentMeshT *pPVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ParentMeshT *pPVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  ulong uVar15;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar16;
  unsigned_long uVar9;
  
  uVar14 = heB.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
  pPVar5 = heB.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
  uVar7 = heA.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind;
  pPVar10 = heA.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh;
  if (this->useImplicitTwinFlag == true) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh."
              );
  }
  else {
    bVar2 = pPVar10->useImplicitTwinFlag;
    if (bVar2 == true) {
      uVar6 = uVar7 >> 1;
    }
    else {
      uVar6 = (pPVar10->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7];
    }
    if (pPVar5->useImplicitTwinFlag == true) {
      uVar8 = uVar14 >> 1;
    }
    else {
      uVar8 = (pPVar5->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar14];
    }
    if (uVar6 == uVar8) {
      if (uVar7 != uVar14) {
        if (bVar2 == false) {
          uVar6 = (pPVar10->heEdgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7];
          uVar8 = (pPVar10->eHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
        }
        else {
          uVar6 = uVar7 >> 1;
          uVar8 = uVar6 * 2;
        }
        puVar3 = (pPVar10->heFaceArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar15 = pPVar10->nFacesFillCount;
        uVar11 = uVar8;
        do {
          uVar12 = uVar8;
          if (puVar3[uVar11] < uVar15) break;
          if (bVar2 == false) {
            uVar11 = (pPVar10->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11];
          }
          else {
            uVar11 = uVar11 ^ 1;
          }
        } while (uVar11 != uVar8);
        do {
          puVar1 = puVar3 + uVar12;
          if (*puVar1 < uVar15) break;
          if (bVar2 == false) {
            uVar12 = (pPVar10->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12];
          }
          else {
            uVar12 = uVar12 ^ 1;
          }
        } while (uVar12 != uVar8);
        if ((*puVar1 < uVar15) || (uVar12 != uVar11)) {
          uVar8 = 0;
          do {
            if (bVar2 == false) {
              uVar12 = (pPVar10->heSiblingArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
            }
            else {
              uVar12 = uVar12 ^ 1;
            }
          } while ((uVar15 <= puVar3[uVar12]) || (uVar8 = uVar8 + 1, uVar12 != uVar11));
          if (2 < uVar8) {
            EVar16 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     )getNewEdge(this);
            uVar9 = EVar16.ind;
            bVar2 = pPVar10->useImplicitTwinFlag;
            if (bVar2 == true) {
              uVar8 = uVar6 * 2;
              uVar15 = uVar8;
            }
            else {
              uVar8 = (pPVar10->eHalfedgeArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
              uVar15 = uVar8;
            }
            do {
              if (uVar8 != uVar14 && uVar8 != uVar7) {
                (this->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] = uVar8;
                break;
              }
              if (bVar2 == false) {
                uVar8 = (pPVar10->heSiblingArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
              }
              else {
                uVar8 = uVar8 ^ 1;
              }
            } while (uVar8 != uVar15);
            if (bVar2 == false) {
              uVar6 = (pPVar10->heSiblingArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
              uVar8 = uVar6;
            }
            else {
              uVar6 = uVar7 ^ 1;
              uVar8 = uVar6;
            }
            while( true ) {
              if (bVar2 == false) {
                uVar15 = (pPVar10->heSiblingArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6];
              }
              else {
                uVar15 = uVar6 ^ 1;
              }
              if (uVar15 == uVar7) break;
              if (bVar2 == false) {
                uVar6 = (pPVar10->heSiblingArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
              }
              else {
                uVar6 = uVar6 ^ 1;
              }
            }
            puVar3 = (this->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3[uVar6] = uVar8;
            bVar2 = pPVar5->useImplicitTwinFlag;
            if (bVar2 == true) {
              uVar6 = uVar14 ^ 1;
              uVar13 = uVar6;
            }
            else {
              uVar6 = (pPVar5->heSiblingArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
              uVar13 = uVar6;
            }
            while( true ) {
              if (bVar2 == false) {
                uVar8 = (pPVar5->heSiblingArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
              }
              else {
                uVar8 = uVar6 ^ 1;
              }
              if (uVar8 == uVar14) break;
              if (bVar2 == false) {
                uVar6 = (pPVar5->heSiblingArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
              }
              else {
                uVar6 = uVar6 ^ 1;
              }
            }
            puVar3[uVar6] = uVar13;
            (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar9] = uVar7;
            puVar4 = (this->heEdgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar4[uVar7] = uVar9;
            puVar4[uVar14] = uVar9;
            puVar3[uVar7] = uVar14;
            puVar3[uVar14] = uVar7;
            this->modificationTick = this->modificationTick + 1;
            return (Edge)EVar16;
          }
        }
        EVar16.ind = uVar6;
        EVar16.mesh = pPVar10;
        return (Edge)EVar16;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"halfedges must be distinct");
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"halfedges must be incident on same edge");
    }
  }
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Edge SurfaceMesh::separateToNewEdge(Halfedge heA, Halfedge heB) {
  if (usesImplicitTwin())
    throw std::runtime_error(
        "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh.");

  if (heA.edge() != heB.edge()) throw std::runtime_error("halfedges must be incident on same edge");
  if (heA == heB) throw std::runtime_error("halfedges must be distinct");

  // If theres <= 2 halfedges incident on the edge, we don't have any work to do.
  Edge e = heA.edge();
  if (e.degree() <= 2) return e;

  Edge newE = getNewEdge();

  // find some other halfedge incident on the old edge, make it e.halfedge()
  for (Halfedge he : e.adjacentHalfedges()) {
    if (he != heA && he != heB) {
      eHalfedgeArr[e.getIndex()] = he.getIndex();
      break;
    }
  }

  removeFromSiblingList(heA);
  removeFromSiblingList(heB);

  eHalfedgeArr[newE.getIndex()] = heA.getIndex();
  heEdgeArr[heA.getIndex()] = newE.getIndex();
  heEdgeArr[heB.getIndex()] = newE.getIndex();
  heSiblingArr[heA.getIndex()] = heB.getIndex();
  heSiblingArr[heB.getIndex()] = heA.getIndex();


  modificationTick++;
  return newE;
}